

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O2

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = (char *)(result->file_name_)._M_string_length;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (result->file_name_)._M_dataplus._M_p;
  }
  poVar2 = std::operator<<(os,pcVar4);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,result->line_number_);
  poVar2 = std::operator<<(poVar2,": ");
  pcVar4 = "Non-fatal failure";
  if (result->type_ == kFatalFailure) {
    pcVar4 = "Fatal failure";
  }
  pcVar3 = "Success";
  if (result->type_ != kSuccess) {
    pcVar3 = pcVar4;
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,":\n");
  poVar2 = std::operator<<(poVar2,(result->message_)._M_dataplus._M_p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    return poVar2;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os
      << result.file_name() << ":" << result.line_number() << ": "
      << (result.type() == TestPartResult::kSuccess ? "Success" :
          result.type() == TestPartResult::kFatalFailure ? "Fatal failure" :
          "Non-fatal failure") << ":\n"
      << result.message() << std::endl;
}